

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O3

void SetContent<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>,unsigned_long>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *content,
               vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_> *backtraces,
               unsigned_long *endContentPosition,string *vec,cmListFileBacktrace *lfbt)

{
  if (*endContentPosition ==
      (long)(content->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(content->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start >> 5) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(content,*endContentPosition + 2);
    std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::resize
              (backtraces,
               ((long)(backtraces->
                      super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>)
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(backtraces->
                      super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>)
                      ._M_impl.super__Vector_impl_data._M_start >> 5) + 2);
    std::__cxx11::string::_M_assign
              ((string *)
               ((content->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish + -1));
    cmListFileBacktrace::operator=
              ((backtraces->
               super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>).
               _M_impl.super__Vector_impl_data._M_finish + -1,lfbt);
    *endContentPosition =
         (long)(content->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish -
         (long)(content->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start >> 5;
    return;
  }
  __assert_fail("endContentPosition == content.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmStateDirectory.cxx"
                ,0xc9,
                "void SetContent(T &, U &, V &, const std::string &, const cmListFileBacktrace &) [T = std::vector<std::basic_string<char>>, U = std::vector<cmListFileBacktrace>, V = unsigned long]"
               );
}

Assistant:

void SetContent(T& content, U& backtraces, V& endContentPosition,
                const std::string& vec, const cmListFileBacktrace& lfbt)
{
  assert(endContentPosition == content.size());

  content.resize(content.size() + 2);
  backtraces.resize(backtraces.size() + 2);

  content.back() = vec;
  backtraces.back() = lfbt;

  endContentPosition = content.size();
}